

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QSize __thiscall QWidgetPrivate::adjustedSize(QWidgetPrivate *this)

{
  byte *pbVar1;
  QWidget *this_00;
  QLayout *pQVar2;
  QWExtra *pQVar3;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QRect QVar14;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  uVar8 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
  uVar11 = uVar8 >> 0x20;
  uVar6 = (uint)(uVar8 >> 0x20);
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    pQVar2 = this->layout;
    uVar10 = (uint)uVar8;
    if (pQVar2 == (QLayout *)0x0) {
      uVar7 = *(uint *)(*(long *)&this_00->field_0x8 + 0x208);
      if ((uVar7 >> 0x1d & 1) != 0) {
        uVar6 = (**(code **)(*(long *)this_00 + 0x80))(this_00,uVar8 & 0xffffffff);
        uVar7 = *(uint *)(*(long *)&this_00->field_0x8 + 0x208);
      }
      uVar7 = uVar7 >> 0x11 & 1 | uVar7 >> 0x14 & 2;
    }
    else {
      iVar5 = (*(pQVar2->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar2->super_QLayoutItem);
      if ((char)iVar5 != '\0') {
        uVar6 = QLayout::totalHeightForWidth(this->layout,uVar10);
      }
      uVar7 = (**(code **)(*(long *)this->layout + 0x88))();
    }
    uVar12 = 200;
    if (200 < (int)uVar10) {
      uVar12 = uVar10;
    }
    if ((uVar7 & 1) == 0) {
      uVar12 = uVar10;
    }
    uVar10 = 100;
    if (100 < (int)uVar6) {
      uVar10 = uVar6;
    }
    if ((uVar7 & 2) == 0) {
      uVar10 = uVar6;
    }
    local_40 = QWidget::pos(this_00);
    lVar9 = QGuiApplication::screenAt(&local_40);
    if (lVar9 == 0) {
      QGuiApplication::primaryScreen();
    }
    auVar13 = QScreen::geometry();
    uVar6 = ((auVar13._8_4_ - auVar13._0_4_) * 2 + 2) / 3;
    if ((int)uVar12 < (int)uVar6) {
      uVar6 = uVar12;
    }
    uVar8 = (ulong)uVar6;
    uVar6 = ((auVar13._12_4_ - auVar13._4_4_) * 2 + 2) / 3;
    if ((int)uVar10 < (int)uVar6) {
      uVar6 = uVar10;
    }
    uVar11 = (ulong)uVar6;
    pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar3 != (QWExtra *)0x0) &&
       (tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
              &(pQVar3->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
       tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl !=
       (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) {
      pbVar1 = (byte *)((long)tVar4.
                              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe1);
      *pbVar1 = *pbVar1 | 2;
    }
  }
  if (((int)uVar8 < 0) || ((int)uVar11 < 0)) {
    QVar14 = QWidget::childrenRect(this_00);
    if (QVar14.y1.m_i.m_i + -1 != QVar14.y2.m_i.m_i || QVar14.x2.m_i.m_i != QVar14.x1.m_i.m_i + -1)
    {
      uVar8 = (ulong)(QVar14.x2.m_i.m_i + QVar14.x1.m_i.m_i + 1);
      uVar11 = (ulong)(QVar14.y2.m_i.m_i + QVar14.y1.m_i.m_i + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar8 & 0xffffffff | uVar11 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QWidgetPrivate::adjustedSize() const
{
    Q_Q(const QWidget);

    QSize s = q->sizeHint();

    if (q->isWindow()) {
        Qt::Orientations exp;
        if (layout) {
            if (layout->hasHeightForWidth())
                s.setHeight(layout->totalHeightForWidth(s.width()));
            exp = layout->expandingDirections();
        } else
        {
            if (q->sizePolicy().hasHeightForWidth())
                s.setHeight(q->heightForWidth(s.width()));
            exp = q->sizePolicy().expandingDirections();
        }
        if (exp & Qt::Horizontal)
            s.setWidth(qMax(s.width(), 200));
        if (exp & Qt::Vertical)
            s.setHeight(qMax(s.height(), 100));

        QRect screen;
        if (const QScreen *screenAtPoint = QGuiApplication::screenAt(q->pos()))
            screen = screenAtPoint->geometry();
        else
            screen = QGuiApplication::primaryScreen()->geometry();

        s.setWidth(qMin(s.width(), screen.width()*2/3));
        s.setHeight(qMin(s.height(), screen.height()*2/3));

        if (QTLWExtra *extra = maybeTopData())
            extra->sizeAdjusted = true;
    }

    if (!s.isValid()) {
        QRect r = q->childrenRect(); // get children rectangle
        if (r.isNull())
            return s;
        s = r.size() + QSize(2 * r.x(), 2 * r.y());
    }

    return s;
}